

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

basic_variable<std::allocator<char>_> *
trial::dynamic::convert::
overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>,_void>
::into(basic_variable<std::allocator<char>_> *__return_storage_ptr__,
      vector<signed_char,_std::allocator<signed_char>_> *array,error_code *param_2)

{
  char *pcVar1;
  char *entry;
  char *other;
  
  basic_array<std::allocator<char>_>::make();
  pcVar1 = *(char **)(array + 8);
  for (other = *(char **)array; other != pcVar1; other = other + 1) {
    detail::overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_signed_char,_void>::
    append(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

static basic_variable<Allocator> into(const std::vector<T>& array,
                                          std::error_code&)
    {
        auto result = basic_array<Allocator>::make();
        for (const auto& entry : array)
        {
            result += entry;
        }
        return result;
    }